

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeNameFilter_TestShell::
~TEST_CommandLineArguments_setExcludeNameFilter_TestShell
          (TEST_CommandLineArguments_setExcludeNameFilter_TestShell *this)

{
  TEST_CommandLineArguments_setExcludeNameFilter_TestShell *this_local;
  
  ~TEST_CommandLineArguments_setExcludeNameFilter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-xn", "name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.invertMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}